

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t wVar2;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *pfVar3;
  long lVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  uint id;
  basic_string_view<wchar_t> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_1
  local_48;
  type local_38;
  
  wVar2 = *begin;
  if ((wVar2 == L'}') || (wVar2 == L':')) {
    pfVar3 = handler->handler;
    basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
    ::next_arg((format_arg *)&local_48.string,&pfVar3->context);
    (pfVar3->arg).type_ = local_38;
    (pfVar3->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar3->arg).value_.field_0.string.size = local_48.string.size;
  }
  else {
    if ((uint)(wVar2 + L'\xffffffd0') < 10) {
      if (wVar2 == L'0') {
        pwVar6 = begin + 1;
        id = 0;
      }
      else {
        pwVar5 = begin + 1;
        id = 0;
        do {
          if (0xccccccc < id) {
            id = 0x80000000;
            pwVar6 = pwVar5 + -1;
            break;
          }
          id = (pwVar5[-1] + id * 10) - 0x30;
          pwVar6 = pwVar5;
          if (pwVar5 == end) break;
          begin = begin + 1;
          wVar2 = *pwVar5;
          pwVar5 = pwVar5 + 1;
          pwVar6 = begin;
        } while ((uint)(wVar2 + L'\xffffffd0') < 10);
        if ((int)id < 0) {
          error_handler::on_error((error_handler *)handler->handler,"number is too big");
        }
      }
      begin = pwVar6;
      if ((pwVar6 != end) && ((*pwVar6 == L':' || (*pwVar6 == L'}')))) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ::on_arg_id(handler->handler,id);
        return pwVar6;
      }
    }
    else if ((wVar2 == L'_') || ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      lVar1 = 4;
      do {
        lVar4 = lVar1;
        pwVar5 = (wchar_t *)((long)begin + lVar4);
        if (pwVar5 == end) break;
        wVar2 = *pwVar5;
        lVar1 = lVar4 + 4;
      } while ((((uint)(wVar2 + L'\xffffffd0') < 10) || (wVar2 == L'_')) ||
              ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a));
      name.size_ = lVar4 >> 2;
      pfVar3 = handler->handler;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
      ::get_arg((format_arg *)&local_48.string,&pfVar3->context,name);
      (pfVar3->arg).type_ = local_38;
      (pfVar3->arg).value_.field_0.long_long_value = local_48.long_long_value;
      (pfVar3->arg).value_.field_0.string.size = local_48.string.size;
      return pwVar5;
    }
    error_handler::on_error((error_handler *)handler->handler,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}